

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void expand_vec_shi(TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,_Bool shr,
                   TCGv_vec v0,TCGv_vec v1,TCGArg imm)

{
  TCGv_vec v;
  TCGv_vec v_00;
  TCGArg TVar1;
  TCGArg TVar2;
  TCGArg TVar3;
  TCGv_vec t2;
  TCGv_vec t1;
  TCGv_vec v1_local;
  TCGv_vec v0_local;
  _Bool shr_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  v = tcg_temp_new_vec_tricore(tcg_ctx,type);
  v_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  TVar1 = tcgv_vec_arg(tcg_ctx,v);
  TVar2 = tcgv_vec_arg(tcg_ctx,v1);
  TVar3 = tcgv_vec_arg(tcg_ctx,v1);
  vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,TVar1,TVar2,TVar3);
  TVar1 = tcgv_vec_arg(tcg_ctx,v_00);
  TVar2 = tcgv_vec_arg(tcg_ctx,v1);
  TVar3 = tcgv_vec_arg(tcg_ctx,v1);
  vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,TVar1,TVar2,TVar3);
  if (shr) {
    tcg_gen_shri_vec_tricore(tcg_ctx,1,v,v,imm + 8);
    tcg_gen_shri_vec_tricore(tcg_ctx,1,v_00,v_00,imm + 8);
  }
  else {
    tcg_gen_shli_vec_tricore(tcg_ctx,1,v,v,imm + 8);
    tcg_gen_shli_vec_tricore(tcg_ctx,1,v_00,v_00,imm + 8);
    tcg_gen_shri_vec_tricore(tcg_ctx,1,v,v,8);
    tcg_gen_shri_vec_tricore(tcg_ctx,1,v_00,v_00,8);
  }
  TVar1 = tcgv_vec_arg(tcg_ctx,v0);
  TVar2 = tcgv_vec_arg(tcg_ctx,v);
  TVar3 = tcgv_vec_arg(tcg_ctx,v_00);
  vec_gen_3_tricore(tcg_ctx,INDEX_op_x86_packus_vec,type,0,TVar1,TVar2,TVar3);
  tcg_temp_free_vec(tcg_ctx,v);
  tcg_temp_free_vec(tcg_ctx,v_00);
  return;
}

Assistant:

static void expand_vec_shi(TCGContext *tcg_ctx, TCGType type, unsigned vece, bool shr,
                           TCGv_vec v0, TCGv_vec v1, TCGArg imm)
{
    TCGv_vec t1, t2;

    tcg_debug_assert(vece == MO_8);

    t1 = tcg_temp_new_vec(tcg_ctx, type);
    t2 = tcg_temp_new_vec(tcg_ctx, type);

    /* Unpack to W, shift, and repack.  Tricky bits:
       (1) Use punpck*bw x,x to produce DDCCBBAA,
           i.e. duplicate in other half of the 16-bit lane.
       (2) For right-shift, add 8 so that the high half of
           the lane becomes zero.  For left-shift, we must
           shift up and down again.
       (3) Step 2 leaves high half zero such that PACKUSWB
           (pack with unsigned saturation) does not modify
           the quantity.  */
    vec_gen_3(tcg_ctx, INDEX_op_x86_punpckl_vec, type, MO_8,
              tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v1));
    vec_gen_3(tcg_ctx, INDEX_op_x86_punpckh_vec, type, MO_8,
              tcgv_vec_arg(tcg_ctx, t2), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v1));

    if (shr) {
        tcg_gen_shri_vec(tcg_ctx, MO_16, t1, t1, imm + 8);
        tcg_gen_shri_vec(tcg_ctx, MO_16, t2, t2, imm + 8);
    } else {
        tcg_gen_shli_vec(tcg_ctx, MO_16, t1, t1, imm + 8);
        tcg_gen_shli_vec(tcg_ctx, MO_16, t2, t2, imm + 8);
        tcg_gen_shri_vec(tcg_ctx, MO_16, t1, t1, 8);
        tcg_gen_shri_vec(tcg_ctx, MO_16, t2, t2, 8);
    }

    vec_gen_3(tcg_ctx, INDEX_op_x86_packus_vec, type, MO_8,
              tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, t1), tcgv_vec_arg(tcg_ctx, t2));
    tcg_temp_free_vec(tcg_ctx, t1);
    tcg_temp_free_vec(tcg_ctx, t2);
}